

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ExpressionOrDistSyntax::setChild
          (ExpressionOrDistSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  DistConstraintListSyntax *local_50;
  ExpressionSyntax *local_48;
  DistConstraintListSyntax *local_30;
  not_null<slang::syntax::DistConstraintListSyntax_*> local_28;
  ExpressionSyntax *local_20;
  not_null<slang::syntax::ExpressionSyntax_*> local_18 [3];
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x6d6a9a);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_48 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x6d6aaa);
      local_48 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1);
    }
    local_20 = local_48;
    not_null<slang::syntax::ExpressionSyntax_*>::not_null<slang::syntax::ExpressionSyntax_*>
              (local_18,&local_20);
    *(ExpressionSyntax **)(in_RDI + 0x18) = local_18[0].ptr;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x6d6af5);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_50 = (DistConstraintListSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x6d6b05);
      local_50 = SyntaxNode::as<slang::syntax::DistConstraintListSyntax>(pSVar1);
    }
    local_30 = local_50;
    not_null<slang::syntax::DistConstraintListSyntax_*>::
    not_null<slang::syntax::DistConstraintListSyntax_*>(&local_28,&local_30);
    *(DistConstraintListSyntax **)(in_RDI + 0x20) = local_28.ptr;
  }
  return;
}

Assistant:

void ExpressionOrDistSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: distribution = child.node() ? &child.node()->as<DistConstraintListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}